

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

void CRYPTO_atomic_store_u32(CRYPTO_atomic_u32 *val,uint32_t desired)

{
  uint32_t desired_local;
  CRYPTO_atomic_u32 *val_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (val->super___atomic_base<unsigned_int>)._M_i = desired;
  UNLOCK();
  return;
}

Assistant:

inline void CRYPTO_atomic_store_u32(CRYPTO_atomic_u32 *val, uint32_t desired) {
  val->store(desired, std::memory_order_seq_cst);
}